

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false,_true>_>_>
::_reduce_by_F(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInF,Index currentIndex)

{
  Column *column_00;
  Column *col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  Index currentIndex_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInF_local;
  Tmp_column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  col._4_4_ = currentIndex;
  pvStack_20 = chainsInF;
  chainsInF_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)column;
  column_local = (Tmp_column *)this;
  column_00 = get_column(this,currentIndex);
  _add_to(this,column_00,(Tmp_column *)chainsInF_local,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (pvStack_20,(value_type_conflict1 *)((long)&col + 4));
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_F(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInF,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);  // Reduce with the column col_g
    chainsInF.push_back(currentIndex);
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);  // Reduce with the column col_g
    chainsInF.emplace_back(currentIndex, operators.get_characteristic() - coef);
  }
}